

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMain.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  deUint32 flags;
  char *fileName;
  Platform *platform_00;
  App *this;
  TestLog log;
  UniquePtr<tcu::App,_de::DefaultDeleter<tcu::App>_> app;
  UniquePtr<tcu::Platform,_de::DefaultDeleter<tcu::Platform>_> platform;
  DirArchive archive;
  CommandLine cmdLine;
  
  setvbuf(_stdout,(char *)0x0,1,0x1000);
  tcu::CommandLine::CommandLine(&cmdLine,argc,argv);
  tcu::DirArchive::DirArchive(&archive,".");
  fileName = tcu::CommandLine::getLogFileName(&cmdLine);
  flags = tcu::CommandLine::getLogFlags(&cmdLine);
  tcu::TestLog::TestLog(&log,fileName,flags);
  platform_00 = createPlatform();
  platform.super_UniqueBase<tcu::Platform,_de::DefaultDeleter<tcu::Platform>_>.m_data.ptr =
       platform_00;
  this = (App *)operator_new(0x48);
  tcu::App::App(this,platform_00,&archive.super_Archive,&log,&cmdLine);
  app.super_UniqueBase<tcu::App,_de::DefaultDeleter<tcu::App>_>.m_data.ptr = this;
  do {
    bVar1 = tcu::App::iterate(app.super_UniqueBase<tcu::App,_de::DefaultDeleter<tcu::App>_>.m_data.
                              ptr);
  } while (bVar1);
  de::details::UniqueBase<tcu::App,_de::DefaultDeleter<tcu::App>_>::~UniqueBase
            (&app.super_UniqueBase<tcu::App,_de::DefaultDeleter<tcu::App>_>);
  de::details::UniqueBase<tcu::Platform,_de::DefaultDeleter<tcu::Platform>_>::~UniqueBase
            (&platform.super_UniqueBase<tcu::Platform,_de::DefaultDeleter<tcu::Platform>_>);
  tcu::TestLog::~TestLog(&log);
  tcu::DirArchive::~DirArchive(&archive);
  tcu::CommandLine::~CommandLine(&cmdLine);
  return 0;
}

Assistant:

int main (int argc, char** argv)
{
#if (DE_OS != DE_OS_WIN32)
	// Set stdout to line-buffered mode (will be fully buffered by default if stdout is pipe).
	setvbuf(stdout, DE_NULL, _IOLBF, 4*1024);
#endif

	try
	{
		tcu::CommandLine				cmdLine		(argc, argv);
		tcu::DirArchive					archive		(".");
		tcu::TestLog					log			(cmdLine.getLogFileName(), cmdLine.getLogFlags());
		de::UniquePtr<tcu::Platform>	platform	(createPlatform());
		de::UniquePtr<tcu::App>			app			(new tcu::App(*platform, archive, log, cmdLine));

		// Main loop.
		for (;;)
		{
			if (!app->iterate())
				break;
		}
	}
	catch (const std::exception& e)
	{
		tcu::die("%s", e.what());
	}

	return 0;
}